

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

void __thiscall
Assimp::FindInvalidDataProcess::ProcessAnimationChannel
          (FindInvalidDataProcess *this,aiNodeAnim *anim)

{
  uint num;
  undefined8 uVar1;
  double dVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  aiQuatKey *paVar9;
  aiVectorKey *paVar10;
  Logger *this_00;
  aiVectorKey v;
  
  if (anim == (aiNodeAnim *)0x0) {
    __assert_fail("nullptr != anim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11c,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  num = anim->mNumPositionKeys;
  bVar3 = false;
  if (num != 1) {
    if (num == 0) {
      if ((anim->mNumRotationKeys == 0) && (anim->mNumScalingKeys == 0)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                      ,0x11e,
                      "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
      }
    }
    else {
      bVar8 = AllIdentical<aiVectorKey>(anim->mPositionKeys,num,this->configEpsilon);
      bVar3 = false;
      if (bVar8) {
        bVar3 = true;
        paVar10 = anim->mPositionKeys;
        uVar1 = *(undefined8 *)&(paVar10->mValue).z;
        dVar2 = paVar10->mTime;
        fVar4 = (paVar10->mValue).x;
        fVar5 = (paVar10->mValue).y;
        operator_delete__(paVar10);
        anim->mNumPositionKeys = 1;
        paVar10 = (aiVectorKey *)operator_new__(0x18);
        anim->mPositionKeys = paVar10;
        paVar10->mTime = dVar2;
        (paVar10->mValue).x = fVar4;
        (paVar10->mValue).y = fVar5;
        v.mValue.z = (float)uVar1;
        (paVar10->mValue).z = v.mValue.z;
      }
    }
  }
  if (1 < anim->mNumRotationKeys) {
    bVar8 = AllIdentical<aiQuatKey>(anim->mRotationKeys,anim->mNumRotationKeys,this->configEpsilon);
    if (bVar8) {
      paVar9 = anim->mRotationKeys;
      fVar6 = (paVar9->mValue).y;
      fVar7 = (paVar9->mValue).z;
      dVar2 = paVar9->mTime;
      fVar4 = (paVar9->mValue).w;
      fVar5 = (paVar9->mValue).x;
      operator_delete__(paVar9);
      anim->mNumRotationKeys = 1;
      paVar9 = (aiQuatKey *)operator_new__(0x18);
      anim->mRotationKeys = paVar9;
      paVar9->mTime = dVar2;
      (paVar9->mValue).w = fVar4;
      (paVar9->mValue).x = fVar5;
      (paVar9->mValue).y = fVar6;
      (paVar9->mValue).z = fVar7;
      bVar3 = true;
    }
  }
  if (1 < anim->mNumScalingKeys) {
    bVar8 = AllIdentical<aiVectorKey>(anim->mScalingKeys,anim->mNumScalingKeys,this->configEpsilon);
    if (bVar8) {
      paVar10 = anim->mScalingKeys;
      uVar1 = *(undefined8 *)&(paVar10->mValue).z;
      dVar2 = paVar10->mTime;
      fVar4 = (paVar10->mValue).x;
      fVar5 = (paVar10->mValue).y;
      operator_delete__(paVar10);
      anim->mNumScalingKeys = 1;
      paVar10 = (aiVectorKey *)operator_new__(0x18);
      anim->mScalingKeys = paVar10;
      paVar10->mTime = dVar2;
      (paVar10->mValue).x = fVar4;
      (paVar10->mValue).y = fVar5;
      v.mValue.z = (float)uVar1;
      (paVar10->mValue).z = v.mValue.z;
      goto LAB_003b53fe;
    }
  }
  if (!bVar3) {
    return;
  }
LAB_003b53fe:
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,"Simplified dummy tracks with just one key");
  return;
}

Assistant:

void FindInvalidDataProcess::ProcessAnimationChannel (aiNodeAnim* anim) {
    ai_assert( nullptr != anim );
    if (anim->mNumPositionKeys == 0 && anim->mNumRotationKeys == 0 && anim->mNumScalingKeys == 0) {
        ai_assert_entry();
        return;
    }

    // Check whether all values in a tracks are identical - in this case
    // we can remove al keys except one.
    // POSITIONS
    int i = 0;
    if (anim->mNumPositionKeys > 1 && AllIdentical(anim->mPositionKeys,anim->mNumPositionKeys,configEpsilon)) {
        aiVectorKey v = anim->mPositionKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mPositionKeys;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys = 1];
        anim->mPositionKeys[0] = v;
        i = 1;
    }

    // ROTATIONS
    if (anim->mNumRotationKeys > 1 && AllIdentical(anim->mRotationKeys,anim->mNumRotationKeys,configEpsilon)) {
        aiQuatKey v = anim->mRotationKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mRotationKeys;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys = 1];
        anim->mRotationKeys[0] = v;
        i = 1;
    }

    // SCALINGS
    if (anim->mNumScalingKeys > 1 && AllIdentical(anim->mScalingKeys,anim->mNumScalingKeys,configEpsilon)) {
        aiVectorKey v = anim->mScalingKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mScalingKeys;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys = 1];
        anim->mScalingKeys[0] = v;
        i = 1;
    }
    if ( 1 == i ) {
        ASSIMP_LOG_WARN("Simplified dummy tracks with just one key");
    }
}